

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int select_cipher(ptls_cipher_suite_t **selected,ptls_cipher_suite_t **candidates,uint8_t *src,
                 uint8_t *end,int server_preference,int server_chacha_priority,
                 ptls_hash_algorithm_t *hash)

{
  int iVar1;
  ulong local_48;
  size_t i;
  uint16_t id;
  ulong uStack_38;
  int ret;
  size_t found_index;
  int server_chacha_priority_local;
  int server_preference_local;
  uint8_t *end_local;
  uint8_t *src_local;
  ptls_cipher_suite_t **candidates_local;
  ptls_cipher_suite_t **selected_local;
  
  uStack_38 = 0xffffffffffffffff;
  found_index._0_4_ = server_chacha_priority;
  found_index._4_4_ = server_preference;
  _server_chacha_priority_local = end;
  end_local = src;
  src_local = (uint8_t *)candidates;
  candidates_local = selected;
  while (end_local != _server_chacha_priority_local) {
    iVar1 = ptls_decode16((uint16_t *)((long)&i + 2),&end_local,_server_chacha_priority_local);
    if (iVar1 != 0) {
      return iVar1;
    }
    for (local_48 = 0; *(long *)(src_local + local_48 * 8) != 0; local_48 = local_48 + 1) {
      if ((**(short **)(src_local + local_48 * 8) == i._2_2_) &&
         ((hash == (ptls_hash_algorithm_t *)0x0 ||
          (*(ptls_hash_algorithm_t **)(*(long *)(src_local + local_48 * 8) + 0x10) == hash)))) {
        if ((found_index._4_4_ == 0) || (((int)found_index != 0 && (i._2_2_ == 0x1303)))) {
          *candidates_local = *(ptls_cipher_suite_t **)(src_local + local_48 * 8);
          return 0;
        }
        if (local_48 < uStack_38) {
          uStack_38 = local_48;
          break;
        }
      }
    }
    if (uStack_38 == 0) break;
    found_index._0_4_ = 0;
    i._4_4_ = 0;
  }
  if (uStack_38 == 0xffffffffffffffff) {
    i._4_4_ = 0x28;
  }
  else {
    *candidates_local = *(ptls_cipher_suite_t **)(src_local + uStack_38 * 8);
    i._4_4_ = 0;
  }
  return i._4_4_;
}

Assistant:

static int select_cipher(ptls_cipher_suite_t **selected, ptls_cipher_suite_t **candidates, const uint8_t *src,
                         const uint8_t *const end, int server_preference, int server_chacha_priority, ptls_hash_algorithm_t *hash)
{
    size_t found_index = SIZE_MAX;
    int ret;

    while (src != end) {
        uint16_t id;
        if ((ret = ptls_decode16(&id, &src, end)) != 0)
            goto Exit;
        for (size_t i = 0; candidates[i] != NULL; ++i) {
            if (candidates[i]->id == id && (hash == NULL || candidates[i]->hash == hash)) {
                if (server_preference && !(server_chacha_priority && id == PTLS_CIPHER_SUITE_CHACHA20_POLY1305_SHA256)) {
                    /* preserve smallest matching index, and proceed to the next input */
                    if (i < found_index) {
                        found_index = i;
                        break;
                    }
                } else {
                    /* return the pointer matching to the first input that can be used */
                    *selected = candidates[i];
                    goto Exit;
                }
            }
        }
        /* first position of the server list matched (server_preference) */
        if (found_index == 0)
            break;
        /* server preference is overridden only if the first entry of client-provided list is chachapoly */
        server_chacha_priority = 0;
    }
    if (found_index != SIZE_MAX) {
        *selected = candidates[found_index];
        ret = 0;
    } else {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
    }

Exit:
    return ret;
}